

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_safe_partial
              (char *source,char *dest,int compressedSize,int targetOutputSize,
              int maxDecompressedSize)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  U16 UVar4;
  ulong uVar5;
  size_t __n;
  undefined1 *puVar6;
  int in_ECX;
  byte *pbVar7;
  int in_EDX;
  undefined1 *in_RSI;
  byte *in_RDI;
  int in_R8D;
  bool bVar8;
  size_t dec64;
  BYTE *copyFrom;
  BYTE *endOfMatch;
  size_t copySize;
  uint s_1;
  uint s;
  BYTE *match;
  size_t length;
  uint token;
  int checkOffset;
  int safeDecode;
  size_t dec64table [8];
  size_t dec32table [8];
  BYTE *dictEnd;
  BYTE *lowLimit;
  BYTE *oexit;
  BYTE *cpy;
  BYTE *oend;
  BYTE *op;
  BYTE *iend;
  BYTE *ip;
  void *in_stack_fffffffffffffe68;
  undefined1 *local_188;
  undefined1 *in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe88;
  uint uVar9;
  uint in_stack_fffffffffffffe8c;
  undefined2 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe92;
  bool bVar10;
  undefined1 uVar11;
  undefined1 *local_148;
  undefined1 *local_128;
  size_t local_120;
  long local_108 [5];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  long local_c8 [8];
  long local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  byte *local_58;
  byte *local_50;
  ulong local_48;
  undefined8 local_40;
  undefined1 *local_38;
  int local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined1 *local_18;
  byte *local_10;
  int local_4;
  
  local_24 = 1;
  local_28 = 1;
  local_30 = 0;
  local_40 = 0;
  local_48 = 0;
  local_58 = in_RDI + in_EDX;
  local_68 = in_RSI + in_R8D;
  local_78 = in_RSI + in_ECX;
  local_88 = 0;
  local_80 = in_RSI;
  local_60 = in_RSI;
  local_50 = in_RDI;
  local_38 = in_RSI;
  local_20 = in_R8D;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memcpy(local_c8,&DAT_001a90d0,0x40);
  memset(local_108,0,0x40);
  local_108[3] = 0xffffffffffffffff;
  local_e0 = 1;
  local_d8 = 2;
  local_d0 = 3;
  bVar8 = local_24 == 1;
  bVar10 = bVar8 && local_48 < 0x10000;
  if ((local_28 != 0) && (local_68 + -0xc < local_78)) {
    local_78 = local_68 + -0xc;
  }
  if ((local_24 == 0) || (local_20 != 0)) {
    uVar11 = bVar10;
    if ((local_24 == 0) && (local_20 == 0)) {
      local_4 = -1;
      if (*local_50 == 0) {
        local_4 = 1;
      }
    }
    else {
      while( true ) {
        pbVar7 = local_50 + 1;
        bVar1 = *local_50;
        local_120 = (size_t)(bVar1 >> 4);
        local_50 = pbVar7;
        if (local_120 == 0xf) {
          local_120 = 0xf;
          uVar9 = in_stack_fffffffffffffe88;
          do {
            pbVar7 = local_50 + 1;
            local_120 = (uint)*local_50 + local_120;
            if (local_24 == 0) {
              in_stack_fffffffffffffe8c = 1;
            }
            else {
              in_stack_fffffffffffffe8c = (uint)(pbVar7 < local_58 + -0xf);
            }
            in_stack_fffffffffffffe88 = uVar9 & 0xffffff;
            if (in_stack_fffffffffffffe8c != 0) {
              in_stack_fffffffffffffe88 = CONCAT13(*local_50 == 0xff,(int3)uVar9);
            }
            uVar9 = in_stack_fffffffffffffe88;
            local_50 = pbVar7;
          } while ((char)(in_stack_fffffffffffffe88 >> 0x18) != '\0');
          if (((bVar8) && (local_60 + local_120 < local_60)) ||
             ((bVar8 && (pbVar7 + local_120 < pbVar7)))) goto LAB_001818a8;
        }
        local_70 = local_60 + local_120;
        if (local_24 != 0) break;
LAB_001811bf:
        if ((local_24 == 0) && (local_68 + -8 < local_70)) goto LAB_001811ea;
        LZ4_wildCopy((void *)CONCAT44(in_R8D,CONCAT13(uVar11,CONCAT12(in_stack_fffffffffffffe92,
                                                                      in_stack_fffffffffffffe90))),
                     (void *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     in_stack_fffffffffffffe80);
        local_128 = local_70;
        local_50 = local_50 + local_120;
        local_60 = local_70;
        UVar4 = LZ4_readLE16(in_stack_fffffffffffffe68);
        local_128 = local_128 + -(long)(int)(uint)UVar4;
        local_50 = local_50 + 2;
        if ((bVar10) && (local_128 < local_80)) goto LAB_001818a8;
        local_120 = (size_t)(bVar1 & 0xf);
        if (local_120 == 0xf) {
          local_120 = 0xf;
          do {
            pbVar7 = local_50;
            if ((local_24 != 0) && (local_58 + -5 < local_50)) goto LAB_001818a8;
            local_50 = local_50 + 1;
            local_120 = (uint)*pbVar7 + local_120;
          } while (*pbVar7 == 0xff);
          if ((bVar8) && (local_60 + local_120 < local_60)) goto LAB_001818a8;
        }
        uVar5 = local_120 + 4;
        if ((local_30 == 2) && (local_128 < local_38)) {
          if (local_68 + -5 < local_60 + uVar5) goto LAB_001818a8;
          if ((ulong)((long)local_38 - (long)local_128) < uVar5) {
            __n = (long)local_38 - (long)local_128;
            memcpy(local_60,(void *)(local_88 - __n),__n);
            local_60 = local_60 + __n;
            uVar5 = uVar5 - __n;
            if ((ulong)((long)local_60 - (long)local_38) < uVar5) {
              puVar6 = local_60 + uVar5;
              local_148 = local_38;
              while (local_60 < puVar6) {
                *local_60 = *local_148;
                local_148 = local_148 + 1;
                local_60 = local_60 + 1;
              }
            }
            else {
              memcpy(local_60,local_38,uVar5);
              local_60 = local_60 + uVar5;
            }
          }
          else {
            memmove(local_60,(void *)(local_88 - ((long)local_38 - (long)local_128)),uVar5);
            local_60 = local_60 + uVar5;
          }
        }
        else {
          local_70 = local_60 + uVar5;
          if ((long)local_60 - (long)local_128 < 8) {
            lVar2 = local_108[(long)local_60 - (long)local_128];
            *local_60 = *local_128;
            local_60[1] = local_128[1];
            local_60[2] = local_128[2];
            local_60[3] = local_128[3];
            lVar3 = local_c8[(long)local_60 - (long)local_128];
            LZ4_copy4(local_60 + 4,local_128 + lVar3);
            local_128 = local_128 + lVar3 + -lVar2;
          }
          else {
            LZ4_copy8(local_60,local_128);
            local_128 = local_128 + 8;
          }
          local_60 = local_60 + 8;
          if (local_68 + -0xc < local_70) {
            if (local_68 + -5 < local_70) goto LAB_001818a8;
            if (local_60 < local_68 + -8) {
              LZ4_wildCopy((void *)CONCAT44(in_R8D,CONCAT13(uVar11,CONCAT12(
                                                  in_stack_fffffffffffffe92,
                                                  in_stack_fffffffffffffe90))),
                           (void *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                           in_stack_fffffffffffffe80);
              local_128 = local_128 + (long)(local_68 + (-8 - (long)local_60));
              local_60 = local_68 + -8;
            }
            while (local_60 < local_70) {
              *local_60 = *local_128;
              local_128 = local_128 + 1;
              local_60 = local_60 + 1;
            }
          }
          else {
            LZ4_wildCopy((void *)CONCAT44(in_R8D,CONCAT13(uVar11,CONCAT12(in_stack_fffffffffffffe92,
                                                                          in_stack_fffffffffffffe90)
                                                         )),
                         (void *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                         in_stack_fffffffffffffe80);
          }
          local_60 = local_70;
        }
      }
      if (local_28 == 0) {
        local_188 = local_68 + -0xc;
      }
      else {
        local_188 = local_78;
      }
      if ((local_70 <= local_188) &&
         (in_stack_fffffffffffffe80 = local_70, local_50 + local_120 <= local_58 + -8))
      goto LAB_001811bf;
LAB_001811ea:
      if (local_28 == 0) {
        if (((local_24 != 0) || (local_70 == local_68)) &&
           ((local_24 == 0 || ((local_50 + local_120 == local_58 && (local_70 <= local_68))))))
        goto LAB_0018128e;
      }
      else if ((local_70 <= local_68) && ((local_24 == 0 || (local_50 + local_120 <= local_58)))) {
LAB_0018128e:
        memcpy(local_60,local_50,local_120);
        if (local_24 == 0) {
          return ((int)local_120 + (int)local_50) - (int)local_10;
        }
        return ((int)local_120 + (int)local_60) - (int)local_18;
      }
LAB_001818a8:
      local_4 = -1 - ((int)local_50 - (int)local_10);
    }
  }
  else {
    bVar8 = false;
    if (local_1c == 1) {
      bVar8 = *local_50 == 0;
    }
    local_4 = -1;
    if (bVar8) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int LZ4_decompress_safe_partial(const char* source, char* dest, int compressedSize, int targetOutputSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize, endOnInputSize, partial, targetOutputSize, noDict, (BYTE*)dest, NULL, 0);
}